

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kpr_mri.c
# Opt level: O0

int fsi(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  char *in_RCX;
  int in_EDX;
  undefined4 in_register_00000014;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  void *user_data_00;
  double extraout_XMM0_Qa;
  double t_00;
  sunrealtype sVar6;
  sunrealtype tmp2;
  sunrealtype tmp1;
  sunrealtype v;
  sunrealtype u;
  sunrealtype e;
  sunrealtype G;
  sunrealtype *rpar;
  
  pdVar5 = (double *)CONCAT44(in_register_00000014,in_EDX);
  dVar1 = *pdVar5;
  dVar2 = pdVar5[2];
  dVar3 = **(double **)(*in_RDI + 0x10);
  dVar4 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  user_data_00 = (void *)(dVar3 * dVar3 + -1.0);
  r(pdVar5,in_RSI,in_EDX,in_RCX,in_R8D,in_R9D);
  t_00 = dVar4 * dVar4 + -2.0;
  sVar6 = s(t_00,user_data_00);
  **(double **)(*in_RSI + 0x10) =
       dVar1 * (((double)user_data_00 - extraout_XMM0_Qa) / (dVar3 * 2.0)) +
       dVar2 * ((t_00 - sVar6) / (dVar4 * 2.0));
  *(undefined8 *)(*(long *)(*in_RSI + 0x10) + 8) = 0;
  return 0;
}

Assistant:

static int fsi(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rpar   = (sunrealtype*)user_data;
  const sunrealtype G = rpar[0];
  const sunrealtype e = rpar[2];
  const sunrealtype u = NV_Ith_S(y, 0);
  const sunrealtype v = NV_Ith_S(y, 1);
  sunrealtype tmp1, tmp2;

  /* fill in the slow implicit RHS function:
     [G e]*[(-1+u^2-r(t))/(2*u))]
     [0 0] [(-2+v^2-s(t))/(2*v)]  */
  tmp1              = (-ONE + u * u - r(t, rpar)) / (TWO * u);
  tmp2              = (-TWO + v * v - s(t, rpar)) / (TWO * v);
  NV_Ith_S(ydot, 0) = G * tmp1 + e * tmp2;
  NV_Ith_S(ydot, 1) = ZERO;

  /* Return with success */
  return 0;
}